

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O2

void __thiscall WSNTopologyBasedEnergy::TopLayer3SentSink(WSNTopologyBasedEnergy *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  WSNTopologyBasedEnergy *this_00;
  WSNTopologyBasedEnergy *pWVar7;
  int *piVar8;
  long lVar9;
  WSNNode *pWVar10;
  allocator<char> local_679;
  int *local_678;
  WSNNode *local_670;
  WSNNode *local_668;
  WSNNode *local_660;
  WSNNode *local_658;
  _InputArray local_650;
  _InputArray local_638;
  undefined8 uStack_620;
  WSNNode *local_610;
  WSNNode *local_608;
  int local_5fc;
  WSNNode *local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  vector<int,_std::allocator<int>_> _array;
  WSNNode local_5a0;
  WSNNode local_568;
  WSNNode local_530;
  WSNNode local_4f8;
  WSNNode local_4c0;
  WSNNode local_488;
  WSNNode local_450;
  WSNNode local_418;
  WSNNode local_3e0;
  WSNNode local_3a8;
  WSNNode local_370;
  WSNNode local_338;
  WSNNode local_300;
  WSNNode local_2c8;
  WSNNode local_290;
  Mat tempimg;
  WSNNode local_1f8;
  WSNNode local_1c0;
  WSNNode local_188;
  WSNNode local_150;
  WSNNode local_118;
  WSNNode local_e0;
  WSNNode local_a8;
  undefined1 local_70 [64];
  
  SelectServalNode(&_array,this);
  local_608 = this->LayerLeaderNode;
  local_670 = this->LayerLeaderNode + 3;
  local_660 = this->node;
  local_610 = this->LayerLeaderNode + 4;
  local_5f8 = &this->sink;
  local_668 = this->LayerLeaderNode + 2;
  local_658 = this->LayerLeaderNode + 1;
  piVar8 = _array.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    if (piVar8 == _array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      for (lVar9 = 0x100; lVar9 != 0x16e0; lVar9 = lVar9 + 0x38) {
        pWVar10 = (WSNNode *)((long)(&(this->sink).color + -4) + lVar9);
        WSNNode::WSNNode(&local_a8,pWVar10);
        pWVar7 = (WSNTopologyBasedEnergy *)local_70;
        WSNNode::NodeColor((Scalar *)local_70,pWVar10);
        drawCrossNode(pWVar7,&this->img,&local_a8,(Scalar *)local_70);
        WSNNode::~WSNNode(&local_a8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tempimg,"WSN",(allocator<char> *)&local_650);
        local_638.sz.width = 0;
        local_638.sz.height = 0;
        local_638.flags = 0x1010000;
        local_638.obj = this;
        cv::imshow((string *)&tempimg,&local_638);
        std::__cxx11::string::~string((string *)&tempimg);
      }
      if (this->Test != false) {
        cv::waitKey(400);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_array.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    cv::Mat::clone();
    SelectLeaderID(this);
    local_650.sz.width = 0;
    local_650.sz.height = 0;
    local_5d8 = 0;
    local_650.flags = 0x3010000;
    local_650.obj = &tempimg;
    local_5e0._0_4_ = local_670->x;
    local_5e0._4_4_ = local_670->y;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_638);
    local_638.flags = 0;
    local_638._4_4_ = 0x40468000;
    local_638.obj = (WSNTopologyBasedEnergy *)0x4062c00000000000;
    local_638.sz.width = 0;
    local_638.sz.height = 0x40468000;
    uStack_620 = 0;
    cv::line(&local_650,&local_5d8,&local_5e0,&local_638,1,8,0);
    for (lVar9 = 0x18e8; pWVar10 = local_660, lVar9 != 0x19c8; lVar9 = lVar9 + 0x38) {
      local_650.sz.width = 0;
      local_650.sz.height = 0;
      local_650.flags = 0x3010000;
      local_650.obj = &tempimg;
      local_5e8 = *(undefined8 *)((long)(&(this->sink).color + -4) + lVar9);
      local_5f0 = *(undefined8 *)
                   ((long)(this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                   lVar9 + -0x48);
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_638);
      local_638.flags = 0;
      local_638._4_4_ = 0;
      local_638.obj = (WSNTopologyBasedEnergy *)0x406fe00000000000;
      local_638.sz.width = 0;
      local_638.sz.height = 0;
      uStack_620 = 0;
      cv::line(&local_650,&local_5e8,&local_5f0,&local_638,1,8,0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"WSN",&local_679);
      local_650.sz.width = 0;
      local_650.sz.height = 0;
      local_650.flags = 0x1010000;
      local_650.obj = &tempimg;
      cv::imshow((string *)&local_638,&local_650);
      std::__cxx11::string::~string((string *)&local_638);
    }
    if (this->Test != false) {
      cv::waitKey(100);
    }
    iVar4 = WSNNode::layer(pWVar10 + *piVar8);
    if (iVar4 == 0) {
      dVar1 = this->alpha;
      WSNNode::WSNNode(&local_290,local_608);
      local_678 = piVar8;
      WSNNode::WSNNode(&local_2c8,local_658);
      iVar6 = local_290.y;
      iVar3 = local_290.x;
      iVar2 = local_2c8.y;
      iVar4 = local_2c8.x;
      iVar5 = WSNNode::GetNodeID(local_608);
      pWVar10 = local_660;
      local_660[iVar5].energy =
           local_660[iVar5].energy -
           (dVar1 * (double)((iVar3 - iVar4) * (iVar3 - iVar4) + (iVar6 - iVar2) * (iVar6 - iVar2))
           + 1.0);
      WSNNode::~WSNNode(&local_2c8);
      WSNNode::~WSNNode(&local_290);
      piVar8 = local_678;
      dVar1 = this->alpha;
      WSNNode::WSNNode(&local_300,pWVar10 + *local_678);
      WSNNode::WSNNode(&local_e0,local_608);
      pWVar10[*piVar8].energy =
           pWVar10[*piVar8].energy -
           (dVar1 * (double)((local_300.y - local_e0.y) * (local_300.y - local_e0.y) +
                            (local_300.x - local_e0.x) * (local_300.x - local_e0.x)) + 0.5);
      WSNNode::~WSNNode(&local_e0);
      WSNNode::~WSNNode(&local_300);
      iVar4 = WSNNode::GetNodeID(local_658);
      pWVar10[iVar4].energy = pWVar10[iVar4].energy + -1.0;
      iVar4 = WSNNode::GetNodeID(local_668);
      pWVar10[iVar4].energy = pWVar10[iVar4].energy + -1.0;
      iVar4 = WSNNode::GetNodeID(local_670);
LAB_001097e1:
      pWVar10[iVar4].energy = pWVar10[iVar4].energy + -1.0;
    }
    else {
      iVar4 = WSNNode::layer(pWVar10 + *piVar8);
      if (iVar4 == 1) {
        dVar1 = this->alpha;
        WSNNode::WSNNode(&local_338,local_658);
        local_678 = piVar8;
        WSNNode::WSNNode(&local_370,local_668);
        iVar6 = local_338.y;
        iVar3 = local_338.x;
        iVar2 = local_370.y;
        iVar4 = local_370.x;
        iVar5 = WSNNode::GetNodeID(local_658);
        pWVar10 = local_660;
        local_660[iVar5].energy =
             local_660[iVar5].energy -
             (dVar1 * (double)((iVar3 - iVar4) * (iVar3 - iVar4) + (iVar6 - iVar2) * (iVar6 - iVar2)
                              ) + 1.0);
        WSNNode::~WSNNode(&local_370);
        WSNNode::~WSNNode(&local_338);
        piVar8 = local_678;
        dVar1 = this->alpha;
        WSNNode::WSNNode(&local_3a8,pWVar10 + *local_678);
        WSNNode::WSNNode(&local_118,local_658);
        pWVar10[*piVar8].energy =
             pWVar10[*piVar8].energy -
             (dVar1 * (double)((local_3a8.y - local_118.y) * (local_3a8.y - local_118.y) +
                              (local_3a8.x - local_118.x) * (local_3a8.x - local_118.x)) + 0.5);
        WSNNode::~WSNNode(&local_118);
        WSNNode::~WSNNode(&local_3a8);
        iVar4 = WSNNode::GetNodeID(local_668);
        pWVar10[iVar4].energy = pWVar10[iVar4].energy + -1.0;
        iVar4 = WSNNode::GetNodeID(local_670);
        goto LAB_001097e1;
      }
      iVar4 = WSNNode::layer(pWVar10 + *piVar8);
      if (iVar4 == 2) {
        dVar1 = this->alpha;
        WSNNode::WSNNode(&local_3e0,local_668);
        local_678 = piVar8;
        WSNNode::WSNNode(&local_418,local_670);
        iVar6 = local_3e0.y;
        iVar3 = local_3e0.x;
        iVar2 = local_418.y;
        iVar4 = local_418.x;
        iVar5 = WSNNode::GetNodeID(local_668);
        pWVar10 = local_660;
        local_660[iVar5].energy =
             local_660[iVar5].energy -
             (dVar1 * (double)((iVar3 - iVar4) * (iVar3 - iVar4) + (iVar6 - iVar2) * (iVar6 - iVar2)
                              ) + 1.0);
        WSNNode::~WSNNode(&local_418);
        WSNNode::~WSNNode(&local_3e0);
        piVar8 = local_678;
        dVar1 = this->alpha;
        WSNNode::WSNNode(&local_450,pWVar10 + *local_678);
        WSNNode::WSNNode(&local_150,local_668);
        pWVar10[*piVar8].energy =
             pWVar10[*piVar8].energy -
             (dVar1 * (double)((local_450.y - local_150.y) * (local_450.y - local_150.y) +
                              (local_450.x - local_150.x) * (local_450.x - local_150.x)) + 0.5);
        WSNNode::~WSNNode(&local_150);
        WSNNode::~WSNNode(&local_450);
        iVar4 = WSNNode::GetNodeID(local_670);
        goto LAB_001097e1;
      }
      iVar4 = WSNNode::layer(pWVar10 + *piVar8);
      local_678 = (int *)this->alpha;
      if (iVar4 != 3) {
        WSNNode::WSNNode(&local_530,local_610);
        WSNNode::WSNNode(&local_568,local_670);
        iVar6 = local_530.y;
        iVar3 = local_530.x;
        iVar2 = local_568.y;
        iVar4 = local_568.x;
        iVar5 = WSNNode::GetNodeID(local_610);
        pWVar10 = local_660;
        local_660[iVar5].energy =
             local_660[iVar5].energy -
             ((double)local_678 *
              (double)((iVar3 - iVar4) * (iVar3 - iVar4) + (iVar6 - iVar2) * (iVar6 - iVar2)) + 1.0)
        ;
        WSNNode::~WSNNode(&local_568);
        WSNNode::~WSNNode(&local_530);
        local_678 = (int *)this->alpha;
        WSNNode::WSNNode(&local_5a0,pWVar10 + *piVar8);
        WSNNode::WSNNode(&local_188,local_610);
        pWVar10[*piVar8].energy =
             pWVar10[*piVar8].energy -
             ((double)local_678 *
              (double)((local_5a0.y - local_188.y) * (local_5a0.y - local_188.y) +
                      (local_5a0.x - local_188.x) * (local_5a0.x - local_188.x)) + 0.5);
        WSNNode::~WSNNode(&local_188);
        WSNNode::~WSNNode(&local_5a0);
        iVar4 = WSNNode::GetNodeID(local_670);
        goto LAB_001097e1;
      }
      WSNNode::WSNNode(&local_488,local_670);
      WSNNode::WSNNode(&local_4c0,local_5f8);
      iVar3 = local_488.y;
      iVar2 = local_488.x;
      iVar4 = local_4c0.y;
      local_5fc = local_4c0.x;
      iVar6 = WSNNode::GetNodeID(local_670);
      pWVar10 = local_660;
      local_660[iVar6].energy =
           local_660[iVar6].energy -
           ((double)local_678 *
            (double)((iVar2 - local_5fc) * (iVar2 - local_5fc) + (iVar3 - iVar4) * (iVar3 - iVar4))
           + 1.0);
      WSNNode::~WSNNode(&local_4c0);
      WSNNode::~WSNNode(&local_488);
      local_678 = (int *)this->alpha;
      WSNNode::WSNNode(&local_4f8,pWVar10 + *piVar8);
      WSNNode::WSNNode(&local_1f8,local_670);
      pWVar10[*piVar8].energy =
           pWVar10[*piVar8].energy -
           ((double)local_678 *
            (double)((local_4f8.y - local_1f8.y) * (local_4f8.y - local_1f8.y) +
                    (local_4f8.x - local_1f8.x) * (local_4f8.x - local_1f8.x)) + 0.5);
      WSNNode::~WSNNode(&local_1f8);
      WSNNode::~WSNNode(&local_4f8);
    }
    WSNNode::WSNNode(&local_1c0,pWVar10 + *piVar8);
    pWVar7 = (WSNTopologyBasedEnergy *)(local_70 + 0x20);
    this_00 = pWVar7;
    WSNNode::NodeColor((Scalar *)pWVar7,pWVar10 + *piVar8);
    drawCrossNode(this_00,&this->img,&local_1c0,(Scalar *)pWVar7);
    WSNNode::~WSNNode(&local_1c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"WSN",&local_679);
    local_650.sz.width = 0;
    local_650.sz.height = 0;
    local_650.flags = 0x1010000;
    local_650.obj = this;
    cv::imshow((string *)&local_638,&local_650);
    std::__cxx11::string::~string((string *)&local_638);
    cv::Mat::~Mat(&tempimg);
    piVar8 = piVar8 + 1;
  } while( true );
}

Assistant:

void WSNTopologyBasedEnergy::TopLayer3SentSink()
{
	vector<int>::iterator it;
	vector<int> _array=SelectServalNode();
	for(it=_array.begin();it!=_array.end();it++)
	{
		Mat tempimg=img.clone();

		//选择每层的leader节点
		SelectLeaderID();


		// 链接所有leader节点
		line(tempimg,Point(0,0),Point(LayerLeaderNode[3].x,LayerLeaderNode[3].y),Scalar(45,150,45),1,8,0);//用黑绿色直线连接sink节点和顶层节点
		for(int i=0;i<LayerNum-1;i++)
		{
			line(tempimg,Point(LayerLeaderNode[i].x,LayerLeaderNode[i].y),Point(LayerLeaderNode[i+1].x,LayerLeaderNode[i+1].y),Scalar(0,255,0));
			imshow("WSN",tempimg);
		}
		if(true==Test) waitKey(100);


		//计算能量变化值
		if(0==node[*it].layer())
		{
			node[LayerLeaderNode[0].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[0],LayerLeaderNode[1]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[0]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;
			node[LayerLeaderNode[2].GetNodeID()].energy-=1;
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}
		else if(1==node[*it].layer())
		{
			node[LayerLeaderNode[1].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[1],LayerLeaderNode[2]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[1]);
			node[LayerLeaderNode[2].GetNodeID()].energy-=1;
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}
		else if(2==node[*it].layer())
		{
			node[LayerLeaderNode[2].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[2],LayerLeaderNode[3]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[2]);
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}

		else if(3==node[*it].layer())
		{
			node[LayerLeaderNode[3].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[3],sink);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[3]);
		}
		else 
		{
			node[LayerLeaderNode[4].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[4],LayerLeaderNode[3]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[4]);
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}

		//不同的能量的节点画不同的颜色
		drawCrossNode(img,node[*it],node[*it].NodeColor());
		imshow("WSN",img);	
	}
	//Leader节点的颜色变化
	for(int i=0;i<NODENUM;i++)
	{
		drawCrossNode(img,node[i],node[i].NodeColor());
		imshow("WSN",img);
	}
	if(true==Test) waitKey(400);   //两次发送的时间间隔
}